

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3TermCmp(char *zLhs,int nLhs,char *zRhs,int nRhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = nLhs - nRhs;
  iVar2 = nRhs;
  if (nLhs < nRhs) {
    iVar2 = nLhs;
  }
  if (((zRhs != (char *)0x0) && (zLhs != (char *)0x0)) && (iVar2 != 0)) {
    iVar2 = memcmp(zLhs,zRhs,(long)iVar2);
    iVar1 = nLhs - nRhs;
    if (iVar2 != 0) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

static int fts3TermCmp(
  const char *zLhs, int nLhs,     /* LHS of comparison */
  const char *zRhs, int nRhs      /* RHS of comparison */
){
  int nCmp = MIN(nLhs, nRhs);
  int res;

  if( nCmp && ALWAYS(zLhs) && ALWAYS(zRhs) ){
    res = memcmp(zLhs, zRhs, nCmp);
  }else{
    res = 0;
  }
  if( res==0 ) res = nLhs - nRhs;

  return res;
}